

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan_string(Lexer *this)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  Token *in_RDI;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  
  uVar2 = (this->m_in)._M_len;
  pcVar3 = (this->m_in)._M_str;
  bVar8 = false;
  sVar7 = this->pos;
  do {
    if (uVar2 <= sVar7) break;
    this->pos = sVar7 + 1;
    cVar1 = pcVar3[sVar7];
    if (cVar1 == '\\') {
      bVar8 = (bool)(bVar8 ^ 1);
      bVar9 = true;
    }
    else if (bVar8) {
      bVar9 = true;
      bVar8 = false;
    }
    else {
      bVar9 = cVar1 != pcVar3[this->tok_start];
      if (bVar9) {
        bVar8 = false;
      }
    }
    sVar7 = sVar7 + 1;
  } while (bVar9);
  uVar5 = this->tok_start;
  if (uVar2 < this->tok_start) {
    uVar5 = uVar2;
  }
  uVar6 = this->pos;
  if (this->pos < uVar5) {
    uVar6 = uVar5;
  }
  if (uVar2 <= uVar6) {
    uVar6 = uVar2;
  }
  uVar4 = uVar2 - uVar5;
  if (uVar6 - uVar5 <= uVar2 - uVar5) {
    uVar4 = uVar6 - uVar5;
  }
  pcVar3 = (this->m_in)._M_str;
  in_RDI->kind = String;
  (in_RDI->text)._M_len = uVar4;
  (in_RDI->text)._M_str = pcVar3 + uVar5;
  return in_RDI;
}

Assistant:

Token scan_string() {
    bool escape {false};
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos++];
      if (ch == '\\') {
        escape = !escape;
      } else if (!escape && ch == m_in[tok_start]) {
        break;
      } else {
        escape = false;
      }
    }
    return make_token(Token::Kind::String);
  }